

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O1

void __thiscall adios2::format::BufferFFS::~BufferFFS(BufferFFS *this)

{
  pointer pcVar1;
  
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__BufferFFS_00883c70;
  free_FFSBuffer(this->m_buffer);
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__Buffer_00883b38;
  pcVar1 = (this->super_Buffer).m_Type._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Buffer).m_Type.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BufferFFS::~BufferFFS() { free_FFSBuffer(m_buffer); }